

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul>::BinaryVecOp
          (BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul> *this,
          GeneratorState *state,Type operatorToken,ConstValueRangeAccess inValueRange)

{
  float *__src;
  float *__src_00;
  int iVar1;
  Type TVar2;
  float fVar3;
  pointer pSVar4;
  pointer pSVar5;
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  ulong uVar6;
  bool bVar7;
  deUint32 dVar8;
  int iVar9;
  VariableType *pVVar10;
  pointer pSVar11;
  float *aMin;
  pointer pSVar12;
  float *bMax;
  VariableType *this_00;
  pointer pSVar13;
  long lVar14;
  pointer pSVar15;
  float *bMin;
  pointer pSVar16;
  pointer pSVar17;
  Scalar *aMax;
  vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> baseTypes;
  Type val;
  ValueRange valueRange;
  vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> local_208;
  VariableType *local_1e8;
  long local_1e0;
  GeneratorState *local_1d8;
  ulong local_1d0;
  VariableType *local_1c8;
  VariableType *local_1c0;
  VariableType *local_1b8;
  VariableType *local_1b0;
  float *pfStack_1a8;
  float *local_1a0;
  ValueRange *local_198;
  Scalar *pSStack_190;
  Scalar *local_188;
  ValueRange local_180;
  ValueRange local_100;
  VariableType local_80;
  
  BinaryOp<4,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<4,_(rsg::Associativity)0>,operatorToken);
  (this->super_BinaryOp<4,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__BinaryOp_00787f58;
  ValueRange::ValueRange(&local_100,inValueRange);
  if (local_100.m_type.m_baseType == TYPE_VOID) {
    iVar9 = state->m_shaderParams->maxExpressionDepth;
    iVar1 = state->m_expressionDepth;
    local_208.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_start = (Type *)0x0;
    local_208.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_finish = (Type *)0x0;
    local_208.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (Type *)0x0;
    local_180.m_type.m_baseType = TYPE_FLOAT;
    std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
    _M_realloc_insert<rsg::VariableType::Type>(&local_208,(iterator)0x0,(Type *)&local_180);
    local_180.m_type.m_baseType = TYPE_INT;
    if (local_208.
        super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_208.
        super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
      _M_realloc_insert<rsg::VariableType::Type>
                (&local_208,
                 (iterator)
                 local_208.
                 super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Type *)&local_180);
    }
    else {
      *local_208.
       super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>._M_impl
       .super__Vector_impl_data._M_finish = TYPE_INT;
      local_208.
      super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_208.
           super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_180.m_type.m_baseType = TYPE_VOID;
    de::Random::
    choose<__gnu_cxx::__normal_iterator<rsg::VariableType::Type*,std::vector<rsg::VariableType::Type,std::allocator<rsg::VariableType::Type>>>,rsg::VariableType::Type*>
              (state->m_random,
               (__normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
                )local_208.
                 super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
                )local_208.
                 super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Type *)&local_180,1);
    TVar2 = local_180.m_type.m_baseType;
    dVar8 = deRandom_getUint32(&state->m_random->m_rnd);
    local_80.m_numElements = (dVar8 & (uint)(2 < iVar9 - iVar1) * 3) + 1;
    local_80.m_typeName._M_dataplus._M_p = (pointer)&local_80.m_typeName.field_2;
    local_80.m_baseType = TVar2;
    local_80.m_precision = PRECISION_NONE;
    local_80.m_typeName._M_string_length = 0;
    local_80.m_typeName.field_2._M_local_buf[0] = '\0';
    local_80.m_elementType = (VariableType *)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ValueRange::ValueRange(&local_180,&local_80);
    VariableType::operator=(&local_100.m_type,&local_180.m_type);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_100.m_min,&local_180.m_min);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_100.m_max,&local_180.m_max);
    ValueRange::~ValueRange(&local_180);
    VariableType::~VariableType(&local_80);
    pSStack_190 = local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_190 = (Scalar *)0x0;
    }
    local_188 = local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
    if (local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_188 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_190;
    valueRange_00.super_ConstValueRangeAccess.m_type = &local_100.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_188;
    local_198 = &local_100;
    computeRandomValueRange(state,valueRange_00);
    if (local_208.
        super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
        _M_impl.super__Vector_impl_data._M_start != (Type *)0x0) {
      operator_delete(local_208.
                      super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.
                            super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.
                            super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  pVVar10 = &(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_type;
  VariableType::operator=(pVVar10,&local_100.m_type);
  iVar9 = VariableType::getScalarSize(pVVar10);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_value.m_value,(long)(iVar9 << 6));
  ValueRange::ValueRange(&local_180,pVVar10);
  local_1c8 = &(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_type;
  VariableType::operator=(local_1c8,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  ValueRange::ValueRange(&local_180,pVVar10);
  local_1c0 = &(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_type;
  local_1d8 = state;
  VariableType::operator=(local_1c0,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  if (0 < (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_type.m_numElements) {
    TVar2 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_type.m_baseType;
    local_1d0 = (ulong)TVar2;
    local_1e0 = 0;
    lVar14 = 0;
    do {
      pSVar15 = local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar13 = local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar11 = local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar16 = local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar10 = VariableType::getElementType(&local_100.m_type);
      if (pSVar13 == pSVar15) {
        pSVar13 = (Scalar *)0x0;
      }
      if (pSVar16 == pSVar11) {
        pSVar16 = (Scalar *)0x0;
      }
      pSVar11 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar15 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pSVar17 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar4 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_leftValueRange.m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_1e8 = VariableType::getElementType(local_1c0);
      if (pSVar17 == pSVar4) {
        pSVar17 = (pointer)0x0;
      }
      if (pSVar11 == pSVar15) {
        pSVar11 = (pointer)0x0;
      }
      pSVar15 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar4 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pSVar12 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar5 = (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_rightValueRange.m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      this_00 = local_1c8;
      local_1b8 = VariableType::getElementType(local_1c8);
      uVar6 = local_1d0;
      __src = (float *)((long)pSVar16 + local_1e0);
      __src_00 = (float *)((long)pSVar13 + local_1e0);
      aMin = (float *)((long)pSVar11 + local_1e0);
      aMax = (Scalar *)((long)pSVar17 + local_1e0);
      if (pSVar12 == pSVar5) {
        pSVar12 = (pointer)0x0;
      }
      if (pSVar15 == pSVar4) {
        pSVar15 = (pointer)0x0;
      }
      bMin = (float *)((long)pSVar15 + local_1e0);
      bMax = (float *)((long)pSVar12 + local_1e0);
      if (TVar2 - TYPE_FLOAT < 2) {
        valueRange_01.m_min = (Scalar *)bMin;
        valueRange_01.m_type = pVVar10;
        valueRange_01.m_max = aMax;
        local_1b0 = pVVar10;
        pfStack_1a8 = __src;
        local_1a0 = __src_00;
        bVar7 = isUndefinedValueRange(valueRange_01);
        if (!bVar7) goto LAB_005bdc6e;
        iVar9 = VariableType::getScalarSize(local_1e8);
        if (iVar9 != 0) {
          memmove(aMin,__src,(long)iVar9 << 2);
        }
        pVVar10 = local_1b8;
        iVar9 = VariableType::getScalarSize(local_1b8);
        if (iVar9 != 0) {
          memmove(bMin,__src,(long)iVar9 << 2);
        }
        iVar9 = VariableType::getScalarSize(local_1e8);
        if (iVar9 != 0) {
          memmove(aMax,__src_00,(long)iVar9 << 2);
        }
        iVar9 = VariableType::getScalarSize(pVVar10);
        if (iVar9 != 0) {
          memmove(bMax,__src_00,(long)iVar9 << 2);
        }
      }
      else {
LAB_005bdc6e:
        if ((int)uVar6 == 2) {
          fVar3 = *__src_00;
          *aMin = *__src;
          aMax->floatVal = fVar3;
          *bMin = 1.4013e-45;
          *bMax = 1.4013e-45;
        }
        else if ((int)uVar6 == 1) {
          ComputeMulRange::operator()
                    ((ComputeMulRange *)this_00,local_1d8->m_random,*__src,*__src_00,aMin,
                     &aMax->floatVal,bMin,bMax);
        }
      }
      lVar14 = lVar14 + 1;
      local_1e0 = local_1e0 + 4;
    } while (lVar14 < (this->super_BinaryOp<4,_(rsg::Associativity)0>).m_type.m_numElements);
  }
  ValueRange::~ValueRange(&local_100);
  return;
}

Assistant:

BinaryVecOp<Precedence, Float, Int, Bool, ComputeValueRange, EvaluateComp>::BinaryVecOp (GeneratorState& state, Token::Type operatorToken, ConstValueRangeAccess inValueRange)
	: BinaryOp<Precedence, ASSOCIATIVITY_LEFT>(operatorToken)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		int							availableLevels	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();
		vector<VariableType::Type>	baseTypes;

		if (Float)	baseTypes.push_back(VariableType::TYPE_FLOAT);
		if (Int)	baseTypes.push_back(VariableType::TYPE_INT);
		if (Bool)	baseTypes.push_back(VariableType::TYPE_BOOL);

		VariableType::Type	baseType	= state.getRandom().choose<VariableType::Type>(baseTypes.begin(), baseTypes.end());
		int					numElements	= state.getRandom().getInt(1, availableLevels >= 3 ? 4 : 1);

		valueRange = ValueRange(VariableType(baseType, numElements));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Initialize storage for value ranges
	this->m_rightValueRange	= ValueRange(this->m_type);
	this->m_leftValueRange	= ValueRange(this->m_type);

	VariableType::Type baseType = this->m_type.getBaseType();

	// Compute range for b that satisfies requested value range
	for (int elemNdx = 0; elemNdx < this->m_type.getNumElements(); elemNdx++)
	{
		ConstValueRangeAccess	dst		= valueRange.asAccess().component(elemNdx);
		ValueRangeAccess		a		= this->m_leftValueRange.asAccess().component(elemNdx); // \todo [2011-03-25 pyry] Commutative: randomize inputs
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess().component(elemNdx);

		// Just pass undefined ranges
		if ((baseType == VariableType::TYPE_FLOAT || baseType == VariableType::TYPE_INT) && isUndefinedValueRange(dst))
		{
			a.getMin() = dst.getMin().value();
			b.getMin() = dst.getMin().value();
			a.getMax() = dst.getMax().value();
			b.getMax() = dst.getMax().value();
			continue;
		}

		if (baseType == VariableType::TYPE_FLOAT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asFloat(), dst.getMax().asFloat(),
								a.getMin().asFloat(), a.getMax().asFloat(),
								b.getMin().asFloat(), b.getMax().asFloat());
		else if (baseType == VariableType::TYPE_INT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asInt(), dst.getMax().asInt(),
								a.getMin().asInt(), a.getMax().asInt(),
								b.getMin().asInt(), b.getMax().asInt());
		else
		{
			DE_ASSERT(baseType == VariableType::TYPE_BOOL);
			ComputeValueRange()(state.getRandom(), dst.getMin().asBool(), dst.getMax().asBool(),
								a.getMin().asBool(), a.getMax().asBool(),
								b.getMin().asBool(), b.getMax().asBool());
		}
	}
}